

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint8_t do_access_get_byte(CPUS390XState_conflict *env,vaddr vaddr,char **haddr,int offset,
                          int mmu_idx,uintptr_t ra)

{
  uint8_t uVar1;
  char *pcVar3;
  tcg_target_ulong tVar2;
  
  if (*haddr == (char *)0x0) {
    tVar2 = helper_ret_ldub_mmu_s390x(env,(long)offset + vaddr,mmu_idx,ra);
    uVar1 = (uint8_t)tVar2;
    pcVar3 = (char *)tlb_vaddr_to_host_s390x(env,vaddr,MMU_DATA_LOAD,mmu_idx);
    *haddr = pcVar3;
  }
  else {
    uVar1 = (*haddr)[offset];
  }
  return uVar1;
}

Assistant:

static uint8_t do_access_get_byte(CPUS390XState *env, vaddr vaddr, char **haddr,
                                  int offset, int mmu_idx, uintptr_t ra)
{
    TCGMemOpIdx oi = make_memop_idx(MO_UB, mmu_idx);
    uint8_t byte;

    if (likely(*haddr)) {
        return ldub_p(*haddr + offset);
    }
    /*
     * Do a single access and test if we can then get access to the
     * page. This is especially relevant to speed up TLB_NOTDIRTY.
     */
    byte = helper_ret_ldub_mmu(env, vaddr + offset, oi, ra);
    *haddr = tlb_vaddr_to_host(env, vaddr, MMU_DATA_LOAD, mmu_idx);
    return byte;
}